

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgssvx.c
# Opt level: O2

void zgssvx(superlu_options_t *options,SuperMatrix *A,int *perm_c,int *perm_r,int *etree,char *equed
           ,double *R,double *C,SuperMatrix *L,SuperMatrix *U,void *work,int_t lwork,SuperMatrix *B,
           SuperMatrix *X,double *recip_pivot_growth,double *rcond,double *ferr,double *berr,
           GlobalLU_t *Glu,mem_usage_t *mem_usage,SuperLUStat_t *stat,int_t *info)

{
  double dVar1;
  char cVar2;
  uint uVar3;
  trans_t tVar4;
  fact_t fVar5;
  yes_no_t yVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  int *piVar10;
  double *pdVar11;
  int_t *piVar12;
  undefined8 uVar13;
  bool bVar14;
  char *pcVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  SuperMatrix *A_00;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  double dVar30;
  double dVar31;
  trans_t local_bc;
  char norm [1];
  int info1;
  char *local_98;
  long local_90;
  long local_88;
  long local_80;
  int *local_78;
  double rowcnd;
  double colcnd;
  long local_60;
  double amax;
  SuperMatrix AC;
  
  piVar9 = (int *)B->Store;
  piVar10 = (int *)X->Store;
  local_88 = *(long *)(piVar9 + 2);
  local_80 = *(long *)(piVar10 + 2);
  local_90 = (long)*piVar9;
  local_60 = (long)*piVar10;
  uVar3 = B->ncol;
  uVar18 = (ulong)uVar3;
  *info = 0;
  tVar4 = options->Trans;
  bVar27 = tVar4 == NOTRANS;
  fVar5 = options->Fact;
  yVar6 = options->Equil;
  local_78 = perm_r;
  if (fVar5 == FACTORED) {
    cVar2 = *equed;
    if (cVar2 == 'R') {
      bVar28 = true;
LAB_00102e91:
      bVar29 = cVar2 == 'B';
    }
    else {
      bVar28 = cVar2 == 'B';
      if (cVar2 != 'C') goto LAB_00102e91;
      bVar29 = true;
    }
    local_98 = equed;
    dVar31 = dmach("Safe minimum");
    in_XMM0_Da = SUB84(dVar31,0);
    in_XMM0_Db = (undefined4)((ulong)dVar31 >> 0x20);
    in_XMM1_Qa = 1.0 / dVar31;
    equed = local_98;
  }
  else {
    *equed = 'N';
    bVar28 = false;
    bVar29 = false;
  }
  iVar16 = -1;
  if (((options->Fact < 4) && (options->Trans < (CONJ|TRANS))) && (options->Equil < 2)) {
    iVar17 = A->nrow;
    iVar16 = -2;
    if (((-1 < (long)iVar17) && (iVar17 == A->ncol)) &&
       (((A->Stype & ~SLU_NR) == SLU_NC && ((A->Dtype == SLU_Z && (A->Mtype == SLU_GE)))))) {
      if ((options->Fact != FACTORED) || (bVar29 || bVar28)) {
        if (bVar28) {
          dVar30 = 0.0;
          dVar31 = in_XMM1_Qa;
          for (lVar21 = 0; iVar17 != lVar21; lVar21 = lVar21 + 1) {
            dVar1 = R[lVar21];
            if (dVar1 <= dVar31) {
              dVar31 = dVar1;
            }
            if (dVar30 <= dVar1) {
              dVar30 = dVar1;
            }
          }
          if (dVar31 <= 0.0) {
            iVar16 = -7;
            goto LAB_0010319c;
          }
          if (iVar17 < 1) {
            rowcnd = 1.0;
          }
          else {
            if (dVar31 <= (double)CONCAT44(in_XMM0_Db,in_XMM0_Da)) {
              dVar31 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
            }
            if (in_XMM1_Qa <= dVar30) {
              dVar30 = in_XMM1_Qa;
            }
            rowcnd = dVar31 / dVar30;
          }
        }
        iVar16 = *info;
        if (bVar29) {
          if (iVar16 != 0) goto LAB_001031a1;
          uVar7 = A->nrow;
          uVar19 = 0;
          uVar20 = 0;
          if (0 < (int)uVar7) {
            uVar20 = (ulong)uVar7;
          }
          dVar30 = 0.0;
          dVar31 = in_XMM1_Qa;
          for (; uVar20 != uVar19; uVar19 = uVar19 + 1) {
            dVar1 = C[uVar19];
            if (dVar1 <= dVar31) {
              dVar31 = dVar1;
            }
            if (dVar30 <= dVar1) {
              dVar30 = dVar1;
            }
          }
          if (dVar31 <= 0.0) {
            iVar16 = -8;
            goto LAB_0010319c;
          }
          if ((int)uVar7 < 1) {
            colcnd = 1.0;
          }
          else {
            if (dVar31 <= (double)CONCAT44(in_XMM0_Db,in_XMM0_Da)) {
              dVar31 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
            }
            if (in_XMM1_Qa <= dVar30) {
              dVar30 = in_XMM1_Qa;
            }
            colcnd = dVar31 / dVar30;
          }
        }
        else {
LAB_00103011:
          if (iVar16 != 0) goto LAB_001031a1;
        }
        if (lwork < -1) {
          iVar17 = -0xc;
LAB_00103069:
          *info = iVar17;
          bVar14 = false;
        }
        else {
          iVar17 = -0xd;
          if (B->ncol < 0) goto LAB_00103069;
          bVar14 = true;
          if (B->ncol != 0) {
            iVar16 = 0;
            if (0 < A->nrow) {
              iVar16 = A->nrow;
            }
            if ((((*piVar9 < iVar16) || (B->Stype != SLU_DN)) || (B->Dtype != SLU_Z)) ||
               (B->Mtype != SLU_GE)) goto LAB_00103069;
          }
          iVar17 = 0;
        }
        iVar8 = X->ncol;
        iVar16 = -0xe;
        if (-1 < iVar8) {
          if (iVar8 != 0) {
            iVar25 = 0;
            if (0 < A->nrow) {
              iVar25 = A->nrow;
            }
            if (((*piVar10 < iVar25) || (B->ncol != 0 && B->ncol != iVar8)) ||
               ((X->Stype != SLU_DN || ((X->Dtype != SLU_Z || (X->Mtype != SLU_GE))))))
            goto LAB_0010319c;
          }
          iVar16 = iVar17;
          if (bVar14) {
            iVar16 = sp_ienv(1);
            iVar17 = sp_ienv(2);
            pdVar11 = stat->utime;
            if (A->Stype == SLU_NR) {
              bVar27 = tVar4 != NOTRANS;
              local_bc = (trans_t)(tVar4 == NOTRANS);
              piVar12 = (int_t *)A->Store;
              A_00 = (SuperMatrix *)superlu_malloc(0x20);
              zCreate_CompCol_Matrix
                        (A_00,A->ncol,A->nrow,*piVar12,*(doublecomplex **)(piVar12 + 2),
                         *(int_t **)(piVar12 + 4),*(int_t **)(piVar12 + 6),SLU_NC,A->Dtype,A->Mtype)
              ;
            }
            else {
              local_bc = options->Trans;
              A_00 = A;
            }
            local_98 = equed;
            if ((fVar5 == FACTORED) || (yVar6 != YES)) {
              if (fVar5 == FACTORED) goto LAB_001033ea;
            }
            else {
              dVar31 = SuperLU_timer_();
              zgsequ(A_00,R,C,&rowcnd,&colcnd,&amax,&info1);
              pcVar15 = local_98;
              if (info1 == 0) {
                zlaqgs(A_00,R,C,rowcnd,colcnd,amax,local_98);
                cVar2 = *pcVar15;
                bVar28 = true;
                if ((cVar2 == 'R') || (bVar28 = cVar2 == 'B', cVar2 != 'C')) {
                  bVar29 = cVar2 == 'B';
                }
                else {
                  bVar29 = true;
                }
              }
              dVar30 = SuperLU_timer_();
              pdVar11[4] = dVar30 - dVar31;
            }
            dVar31 = SuperLU_timer_();
            if ((options->ColPerm != MY_PERMC) && (options->Fact == DOFACT)) {
              get_perm_c(options->ColPerm,A_00,perm_c);
            }
            dVar30 = SuperLU_timer_();
            *pdVar11 = dVar30 - dVar31;
            dVar31 = SuperLU_timer_();
            sp_preorder(options,A_00,perm_c,etree,&AC);
            dVar30 = SuperLU_timer_();
            pdVar11[3] = dVar30 - dVar31;
            dVar31 = SuperLU_timer_();
            zgstrf(options,&AC,iVar17,iVar16,etree,work,lwork,perm_c,local_78,L,U,Glu,stat,info);
            dVar30 = SuperLU_timer_();
            pdVar11[7] = dVar30 - dVar31;
            if (lwork == -1) {
              mem_usage->total_needed = (float)(*info - A->ncol);
              return;
            }
LAB_001033ea:
            iVar16 = *info;
            if (0 < iVar16) {
              if (A->ncol < iVar16) {
                return;
              }
              dVar31 = zPivotGrowth(iVar16,A_00,perm_c,L,U);
              *recip_pivot_growth = dVar31;
              return;
            }
            if (options->PivotGrowth != NO) {
              dVar31 = zPivotGrowth(A->ncol,A_00,perm_c,L,U);
              *recip_pivot_growth = dVar31;
            }
            if (options->ConditionNumber != NO) {
              dVar31 = SuperLU_timer_();
              norm[0] = 'I';
              if (bVar27) {
                norm[0] = '1';
              }
              dVar30 = zlangs(norm,A_00);
              zgscon(norm,L,U,dVar30,rcond,stat,&info1);
              dVar30 = SuperLU_timer_();
              pdVar11[0x10] = dVar30 - dVar31;
            }
            if (0 < (int)uVar3) {
              if (bVar27) {
                if (bVar28) {
                  uVar20 = 0;
                  uVar19 = (ulong)(uint)A->nrow;
                  if (A->nrow < 1) {
                    uVar19 = uVar20;
                  }
                  lVar21 = local_88 + 8;
                  for (; uVar20 != uVar18; uVar20 = uVar20 + 1) {
                    for (lVar24 = 0; uVar19 * 8 != lVar24; lVar24 = lVar24 + 8) {
                      *(double *)(lVar21 + -8 + lVar24 * 2) =
                           *(double *)(lVar21 + -8 + lVar24 * 2) * *(double *)((long)R + lVar24);
                      *(double *)(lVar21 + lVar24 * 2) =
                           *(double *)(lVar21 + lVar24 * 2) * *(double *)((long)R + lVar24);
                    }
                    lVar21 = lVar21 + local_90 * 0x10;
                  }
                }
              }
              else if (bVar29) {
                uVar20 = 0;
                uVar19 = (ulong)(uint)A->nrow;
                if (A->nrow < 1) {
                  uVar19 = uVar20;
                }
                lVar21 = local_88 + 8;
                for (; uVar20 != uVar18; uVar20 = uVar20 + 1) {
                  for (lVar24 = 0; uVar19 * 8 != lVar24; lVar24 = lVar24 + 8) {
                    *(double *)(lVar21 + -8 + lVar24 * 2) =
                         *(double *)(lVar21 + -8 + lVar24 * 2) * *(double *)((long)C + lVar24);
                    *(double *)(lVar21 + lVar24 * 2) =
                         *(double *)(lVar21 + lVar24 * 2) * *(double *)((long)C + lVar24);
                  }
                  lVar21 = lVar21 + local_90 * 0x10;
                }
              }
              lVar26 = local_60 * 0x10;
              lVar21 = local_80;
              lVar24 = local_88;
              for (uVar19 = 0; uVar19 != uVar18; uVar19 = uVar19 + 1) {
                lVar22 = 0;
                for (lVar23 = 0; lVar23 < B->nrow; lVar23 = lVar23 + 1) {
                  uVar13 = ((undefined8 *)(lVar24 + lVar22))[1];
                  *(undefined8 *)(lVar21 + lVar22) = *(undefined8 *)(lVar24 + lVar22);
                  ((undefined8 *)(lVar21 + lVar22))[1] = uVar13;
                  lVar22 = lVar22 + 0x10;
                }
                lVar24 = lVar24 + local_90 * 0x10;
                lVar21 = lVar21 + lVar26;
              }
              dVar31 = SuperLU_timer_();
              zgstrs(local_bc,L,U,perm_c,local_78,X,stat,&info1);
              dVar30 = SuperLU_timer_();
              pdVar11[0x11] = dVar30 - dVar31;
              dVar31 = SuperLU_timer_();
              if (options->IterRefine == NOREFINE) {
                for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
                  berr[uVar19] = 1.0;
                  ferr[uVar19] = 1.0;
                }
              }
              else {
                zgsrfs(local_bc,A_00,L,U,perm_c,local_78,local_98,R,C,B,X,ferr,berr,stat,&info1);
              }
              dVar30 = SuperLU_timer_();
              pdVar11[0x12] = dVar30 - dVar31;
              if (bVar27) {
                if (bVar29) {
                  uVar20 = 0;
                  uVar19 = (ulong)(uint)A->nrow;
                  if (A->nrow < 1) {
                    uVar19 = uVar20;
                  }
                  lVar21 = local_80 + 8;
                  for (; uVar20 != uVar18; uVar20 = uVar20 + 1) {
                    for (lVar24 = 0; uVar19 * 8 != lVar24; lVar24 = lVar24 + 8) {
                      *(double *)(lVar21 + -8 + lVar24 * 2) =
                           *(double *)(lVar21 + -8 + lVar24 * 2) * *(double *)((long)C + lVar24);
                      *(double *)(lVar21 + lVar24 * 2) =
                           *(double *)(lVar21 + lVar24 * 2) * *(double *)((long)C + lVar24);
                    }
                    lVar21 = lVar21 + lVar26;
                  }
                }
              }
              else if (bVar28) {
                uVar20 = 0;
                uVar19 = (ulong)(uint)A->nrow;
                if (A->nrow < 1) {
                  uVar19 = uVar20;
                }
                lVar21 = local_80 + 8;
                for (; uVar20 != uVar18; uVar20 = uVar20 + 1) {
                  for (lVar24 = 0; uVar19 * 8 != lVar24; lVar24 = lVar24 + 8) {
                    *(double *)(lVar21 + -8 + lVar24 * 2) =
                         *(double *)(lVar21 + -8 + lVar24 * 2) * *(double *)((long)R + lVar24);
                    *(double *)(lVar21 + lVar24 * 2) =
                         *(double *)(lVar21 + lVar24 * 2) * *(double *)((long)R + lVar24);
                  }
                  lVar21 = lVar21 + lVar26;
                }
              }
            }
            if ((options->ConditionNumber != NO) &&
               (dVar31 = *rcond, dVar30 = dmach("E"), dVar31 < dVar30)) {
              *info = A->ncol + 1;
            }
            if (fVar5 != FACTORED) {
              zQuerySpace(L,U,mem_usage);
              Destroy_CompCol_Permuted(&AC);
            }
            if (A->Stype != SLU_NR) {
              return;
            }
            Destroy_SuperMatrix_Store(A_00);
            superlu_free(A_00);
            return;
          }
          goto LAB_001031a1;
        }
      }
      else {
        if (*equed == 'N') {
          iVar16 = *info;
          goto LAB_00103011;
        }
        iVar16 = -6;
      }
    }
  }
LAB_0010319c:
  *info = iVar16;
LAB_001031a1:
  AC.Stype = -iVar16;
  input_error("zgssvx",(int *)&AC);
  return;
}

Assistant:

void
zgssvx(superlu_options_t *options, SuperMatrix *A, int *perm_c, int *perm_r,
       int *etree, char *equed, double *R, double *C,
       SuperMatrix *L, SuperMatrix *U, void *work, int_t lwork,
       SuperMatrix *B, SuperMatrix *X, double *recip_pivot_growth, 
       double *rcond, double *ferr, double *berr, 
       GlobalLU_t *Glu, mem_usage_t *mem_usage, SuperLUStat_t *stat, int_t *info )
{

    DNformat  *Bstore, *Xstore;
    doublecomplex    *Bmat, *Xmat;
    int       ldb, ldx, nrhs;
    SuperMatrix *AA;/* A in SLU_NC format used by the factorization routine.*/
    SuperMatrix AC; /* Matrix postmultiplied by Pc */
    int       colequ, equil, nofact, notran, rowequ, permc_spec;
    trans_t   trant;
    char      norm[1];
    int       i, j, info1;
    double    amax, anorm, bignum, smlnum, colcnd, rowcnd, rcmax, rcmin;
    int       relax, panel_size;
    double    t0;      /* temporary time */
    double    *utime;

    /* External functions */
    extern double zlangs(char *, SuperMatrix *);

    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;

    *info = 0;
    nofact = (options->Fact != FACTORED);
    equil = (options->Equil == YES);
    notran = (options->Trans == NOTRANS);
    if ( nofact ) {
	*(unsigned char *)equed = 'N';
	rowequ = FALSE;
	colequ = FALSE;
    } else {
	rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	smlnum = dmach("Safe minimum");   /* lamch_("Safe minimum"); */
	bignum = 1. / smlnum;
    }

#if 0
printf("dgssvx: Fact=%4d, Trans=%4d, equed=%c\n",
       options->Fact, options->Trans, *equed);
#endif

    /* Test the input parameters */
    if ( (options->Fact != DOFACT && options->Fact != SamePattern &&
	  options->Fact != SamePattern_SameRowPerm &&
	  options->Fact != FACTORED) || 
	 (options->Trans != NOTRANS && options->Trans != TRANS && 
	  options->Trans != CONJ) ||
	 (options->Equil != NO && options->Equil != YES) )
	 *info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      (A->Stype != SLU_NC && A->Stype != SLU_NR) ||
	      A->Dtype != SLU_Z || A->Mtype != SLU_GE )
	*info = -2;
    else if ( options->Fact == FACTORED &&
	     !(rowequ || colequ || strncmp(equed, "N", 1)==0) )
	*info = -6;
    else {
	if (rowequ) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, R[j]);
		rcmax = SUPERLU_MAX(rcmax, R[j]);
	    }
	    if (rcmin <= 0.) *info = -7;
	    else if ( A->nrow > 0)
		rowcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else rowcnd = 1.;
	}
	if (colequ && *info == 0) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, C[j]);
		rcmax = SUPERLU_MAX(rcmax, C[j]);
	    }
	    if (rcmin <= 0.) *info = -8;
	    else if (A->nrow > 0)
		colcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else colcnd = 1.;
	}
	if (*info == 0) {
	    if ( lwork < -1 ) *info = -12;
	    else if ( B->ncol < 0 ) *info = -13;
	    else if ( B->ncol > 0 ) { /* no checking if B->ncol=0 */
	         if ( Bstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      B->Stype != SLU_DN || B->Dtype != SLU_Z || 
		      B->Mtype != SLU_GE )
		*info = -13;
            }
	    if ( X->ncol < 0 ) *info = -14;
            else if ( X->ncol > 0 ) { /* no checking if X->ncol=0 */
                 if ( Xstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      (B->ncol != 0 && B->ncol != X->ncol) ||
                      X->Stype != SLU_DN ||
		      X->Dtype != SLU_Z || X->Mtype != SLU_GE )
		*info = -14;
            }
	}
    }
    if (*info != 0) {
	i = -(*info);
	input_error("zgssvx", &i);
	return;
    }
    
    /* Initialization for factor parameters */
    panel_size = sp_ienv(1);
    relax      = sp_ienv(2);

    utime = stat->utime;
    
    /* Convert A to SLU_NC format when necessary. */
    if ( A->Stype == SLU_NR ) {
	NRformat *Astore = A->Store;
	AA = (SuperMatrix *) SUPERLU_MALLOC( sizeof(SuperMatrix) );
	zCreate_CompCol_Matrix(AA, A->ncol, A->nrow, Astore->nnz, 
			       Astore->nzval, Astore->colind, Astore->rowptr,
			       SLU_NC, A->Dtype, A->Mtype);
	if ( notran ) { /* Reverse the transpose argument. */
	    trant = TRANS;
	    notran = 0;
	} else {
	    trant = NOTRANS;
	    notran = 1;
	}
    } else { /* A->Stype == SLU_NC */
	trant = options->Trans;
	AA = A;
    }

    if ( nofact && equil ) {
	t0 = SuperLU_timer_();
	/* Compute row and column scalings to equilibrate the matrix A. */
	zgsequ(AA, R, C, &rowcnd, &colcnd, &amax, &info1);
	
	if ( info1 == 0 ) {
	    /* Equilibrate matrix A. */
	    zlaqgs(AA, R, C, rowcnd, colcnd, amax, equed);
	    rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	    colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	}
	utime[EQUIL] = SuperLU_timer_() - t0;
    }


    if ( nofact ) {
	
        t0 = SuperLU_timer_();
	/*
	 * Gnet column permutation vector perm_c[], according to permc_spec:
	 *   permc_spec = NATURAL:  natural ordering 
	 *   permc_spec = MMD_AT_PLUS_A: minimum degree on structure of A'+A
	 *   permc_spec = MMD_ATA:  minimum degree on structure of A'*A
	 *   permc_spec = COLAMD:   approximate minimum degree column ordering
	 *   permc_spec = MY_PERMC: the ordering already supplied in perm_c[]
	 */
	permc_spec = options->ColPerm;
	if ( permc_spec != MY_PERMC && options->Fact == DOFACT )
            get_perm_c(permc_spec, AA, perm_c);
	utime[COLPERM] = SuperLU_timer_() - t0;

	t0 = SuperLU_timer_();
	sp_preorder(options, AA, perm_c, etree, &AC);
	utime[ETREE] = SuperLU_timer_() - t0;
    
/*	printf("Factor PA = LU ... relax %d\tw %d\tmaxsuper %d\trowblk %d\n", 
	       relax, panel_size, sp_ienv(3), sp_ienv(4));
	fflush(stdout); */
	
	/* Compute the LU factorization of A*Pc. */
	t0 = SuperLU_timer_();
	zgstrf(options, &AC, relax, panel_size, etree,
                work, lwork, perm_c, perm_r, L, U, Glu, stat, info);
	utime[FACT] = SuperLU_timer_() - t0;
	
	if ( lwork == -1 ) {
	    mem_usage->total_needed = *info - A->ncol;
	    return;
	}
    }

    if ( *info > 0 ) { 
        if ( *info <= A->ncol ) { /* singular */
	    /* Compute the reciprocal pivot growth factor of the leading
	       rank-deficient (*info) columns of A. */
	    *recip_pivot_growth = zPivotGrowth(*info, AA, perm_c, L, U);
        }
	return;
    }

    /* *info == 0 at this point. */

    if ( options->PivotGrowth ) {
        /* Compute the reciprocal pivot growth factor *recip_pivot_growth. */
        *recip_pivot_growth = zPivotGrowth(A->ncol, AA, perm_c, L, U);
    }

    if ( options->ConditionNumber ) {
        /* Estimate the reciprocal of the condition number of A. */
        t0 = SuperLU_timer_();
        if ( notran ) {
	    *(unsigned char *)norm = '1';
        } else {
	    *(unsigned char *)norm = 'I';
        }
        anorm = zlangs(norm, AA);
        zgscon(norm, L, U, anorm, rcond, stat, &info1);
        utime[RCOND] = SuperLU_timer_() - t0;
    }
    
    if ( nrhs > 0 ) {
        /* Scale the right hand side if equilibration was performed. */
        if ( notran ) {
	    if ( rowequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i)
                        zd_mult(&Bmat[i+j*ldb], &Bmat[i+j*ldb], R[i]);
	    }
        } else if ( colequ ) {
	    for (j = 0; j < nrhs; ++j)
	        for (i = 0; i < A->nrow; ++i)
                    zd_mult(&Bmat[i+j*ldb], &Bmat[i+j*ldb], C[i]);
        }

        /* Compute the solution matrix X. */
        for (j = 0; j < nrhs; j++)  /* Save a copy of the right hand sides */
            for (i = 0; i < B->nrow; i++)
	        Xmat[i + j*ldx] = Bmat[i + j*ldb];
    
        t0 = SuperLU_timer_();
        zgstrs (trant, L, U, perm_c, perm_r, X, stat, &info1);
        utime[SOLVE] = SuperLU_timer_() - t0;
    
        /* Use iterative refinement to improve the computed solution and compute
           error bounds and backward error estimates for it. */
        t0 = SuperLU_timer_();
        if ( options->IterRefine != NOREFINE ) {
            zgsrfs(trant, AA, L, U, perm_c, perm_r, equed, R, C, B,
                   X, ferr, berr, stat, &info1);
        } else {
            for (j = 0; j < nrhs; ++j) ferr[j] = berr[j] = 1.0;
        }
        utime[REFINE] = SuperLU_timer_() - t0;

        /* Transform the solution matrix X to a solution of the original system. */
        if ( notran ) {
	    if ( colequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i)
                        zd_mult(&Xmat[i+j*ldx], &Xmat[i+j*ldx], C[i]);
	    }
        } else if ( rowequ ) {
	    for (j = 0; j < nrhs; ++j)
	        for (i = 0; i < A->nrow; ++i)
                    zd_mult(&Xmat[i+j*ldx], &Xmat[i+j*ldx], R[i]);
        }
    } /* end if nrhs > 0 */

    if ( options->ConditionNumber ) {
        /* Set INFO = A->ncol+1 if the matrix is singular to working precision. */
        /*if ( *rcond < dlamch_("E") ) *info = A->ncol + 1;*/
        if ( *rcond < dmach("E") ) *info = A->ncol + 1;
    }

    if ( nofact ) {
        zQuerySpace(L, U, mem_usage);
        Destroy_CompCol_Permuted(&AC);
    }
    if ( A->Stype == SLU_NR ) {
	Destroy_SuperMatrix_Store(AA);
	SUPERLU_FREE(AA);
    }

}